

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_3::writeVariableReadAccumulateExpression
               (ostringstream *buf,string *accumulatorName,string *name,ShaderType shaderType,
               Storage storage,Program *program,VarType *varType)

{
  Program *pPVar1;
  Storage SVar2;
  ShaderType SVar3;
  string *psVar4;
  string *psVar5;
  bool bVar6;
  DataType DVar7;
  int iVar8;
  int iVar9;
  deUint32 dVar10;
  ostream *poVar11;
  StructType *pSVar12;
  StructMember *pSVar13;
  char *__rhs;
  VarType *pVVar14;
  string local_1f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  int local_16c;
  undefined1 local_168 [4];
  int ndx_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  int local_88 [2];
  int ndx_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  int local_34;
  Program *pPStack_30;
  int ndx;
  Program *program_local;
  Storage storage_local;
  ShaderType shaderType_local;
  string *name_local;
  string *accumulatorName_local;
  ostringstream *buf_local;
  
  pPStack_30 = program;
  program_local._0_4_ = storage;
  program_local._4_4_ = shaderType;
  _storage_local = name;
  name_local = accumulatorName;
  accumulatorName_local = (string *)buf;
  bVar6 = glu::VarType::isBasicType(varType);
  if (bVar6) {
    poVar11 = std::operator<<((ostream *)accumulatorName_local,"\t");
    poVar11 = std::operator<<(poVar11,(string *)name_local);
    std::operator<<(poVar11," += ");
    DVar7 = glu::VarType::getBasicType(varType);
    bVar6 = glu::isDataTypeScalar(DVar7);
    if (bVar6) {
      poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(float(");
      poVar11 = std::operator<<(poVar11,(string *)_storage_local);
      std::operator<<(poVar11,"))");
    }
    else {
      DVar7 = glu::VarType::getBasicType(varType);
      bVar6 = glu::isDataTypeVector(DVar7);
      if (bVar6) {
        poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(");
        poVar11 = std::operator<<(poVar11,(string *)_storage_local);
        std::operator<<(poVar11,".xyxy)");
      }
      else {
        DVar7 = glu::VarType::getBasicType(varType);
        bVar6 = glu::isDataTypeMatrix(DVar7);
        if (bVar6) {
          poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(float(");
          poVar11 = std::operator<<(poVar11,(string *)_storage_local);
          std::operator<<(poVar11,"[0][0]))");
        }
        else {
          DVar7 = glu::VarType::getBasicType(varType);
          bVar6 = glu::isDataTypeSamplerMultisample(DVar7);
          if (bVar6) {
            poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(float(textureSize(");
            poVar11 = std::operator<<(poVar11,(string *)_storage_local);
            std::operator<<(poVar11,").x))");
          }
          else {
            DVar7 = glu::VarType::getBasicType(varType);
            bVar6 = glu::isDataTypeSampler(DVar7);
            if (bVar6) {
              poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(float(textureSize(");
              poVar11 = std::operator<<(poVar11,(string *)_storage_local);
              std::operator<<(poVar11,", 0).x))");
            }
            else {
              DVar7 = glu::VarType::getBasicType(varType);
              bVar6 = glu::isDataTypeImage(DVar7);
              if (bVar6) {
                poVar11 = std::operator<<((ostream *)accumulatorName_local,"vec4(float(imageSize(");
                poVar11 = std::operator<<(poVar11,(string *)_storage_local);
                std::operator<<(poVar11,").x))");
              }
              else {
                DVar7 = glu::VarType::getBasicType(varType);
                if (DVar7 == TYPE_UINT_ATOMIC_COUNTER) {
                  poVar11 = std::operator<<((ostream *)accumulatorName_local,
                                            "vec4(float(atomicCounterIncrement(");
                  poVar11 = std::operator<<(poVar11,(string *)_storage_local);
                  std::operator<<(poVar11,")))");
                }
              }
            }
          }
        }
      }
    }
    std::operator<<((ostream *)accumulatorName_local,";\n");
  }
  else {
    bVar6 = glu::VarType::isStructType(varType);
    if (bVar6) {
      local_34 = 0;
      while( true ) {
        iVar8 = local_34;
        pSVar12 = glu::VarType::getStructPtr(varType);
        iVar9 = glu::StructType::getNumMembers(pSVar12);
        psVar5 = accumulatorName_local;
        psVar4 = name_local;
        if (iVar9 <= iVar8) break;
        std::operator+(&local_78,_storage_local,".");
        pSVar12 = glu::VarType::getStructPtr(varType);
        pSVar13 = glu::StructType::getMember(pSVar12,local_34);
        __rhs = glu::StructMember::getName(pSVar13);
        std::operator+(&local_58,&local_78,__rhs);
        SVar3 = program_local._4_4_;
        SVar2 = (Storage)program_local;
        pPVar1 = pPStack_30;
        pSVar12 = glu::VarType::getStructPtr(varType);
        pSVar13 = glu::StructType::getMember(pSVar12,local_34);
        pVVar14 = glu::StructMember::getType(pSVar13);
        writeVariableReadAccumulateExpression
                  ((ostringstream *)psVar5,psVar4,&local_58,SVar3,SVar2,pPVar1,pVVar14);
        std::__cxx11::string::~string((string *)&local_58);
        std::__cxx11::string::~string((string *)&local_78);
        local_34 = local_34 + 1;
      }
    }
    else {
      bVar6 = glu::VarType::isArrayType(varType);
      if (bVar6) {
        iVar8 = glu::VarType::getArraySize(varType);
        psVar5 = accumulatorName_local;
        psVar4 = name_local;
        if (iVar8 == -1) {
          if ((Storage)program_local == STORAGE_BUFFER) {
            std::operator+(&local_128,_storage_local,"[8]");
            SVar3 = program_local._4_4_;
            SVar2 = (Storage)program_local;
            pPVar1 = pPStack_30;
            pVVar14 = glu::VarType::getElementType(varType);
            writeVariableReadAccumulateExpression
                      ((ostringstream *)psVar5,psVar4,&local_128,SVar3,SVar2,pPVar1,pVVar14);
            std::__cxx11::string::~string((string *)&local_128);
          }
          else if (program_local._4_4_ == SHADERTYPE_GEOMETRY) {
            std::operator+(&local_148,_storage_local,"[0]");
            SVar3 = program_local._4_4_;
            SVar2 = (Storage)program_local;
            pPVar1 = pPStack_30;
            pVVar14 = glu::VarType::getElementType(varType);
            writeVariableReadAccumulateExpression
                      ((ostringstream *)psVar5,psVar4,&local_148,SVar3,SVar2,pPVar1,pVVar14);
            std::__cxx11::string::~string((string *)&local_148);
          }
          else if (program_local._4_4_ == SHADERTYPE_TESSELLATION_CONTROL) {
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_168,_storage_local,"[gl_InvocationID]");
            SVar3 = program_local._4_4_;
            SVar2 = (Storage)program_local;
            pPVar1 = pPStack_30;
            pVVar14 = glu::VarType::getElementType(varType);
            writeVariableReadAccumulateExpression
                      ((ostringstream *)psVar5,psVar4,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_168,SVar3,SVar2,pPVar1,pVVar14);
            std::__cxx11::string::~string((string *)local_168);
          }
          else if (program_local._4_4_ == SHADERTYPE_TESSELLATION_EVALUATION) {
            for (local_16c = 0; iVar8 = local_16c,
                dVar10 = ProgramInterfaceDefinition::Program::getTessellationNumOutputPatchVertices
                                   (pPStack_30), psVar5 = accumulatorName_local, psVar4 = name_local
                , iVar8 < (int)dVar10; local_16c = local_16c + 1) {
              std::operator+(&local_1d0,_storage_local,"[");
              de::toString<int>(&local_1f0,&local_16c);
              std::operator+(&local_1b0,&local_1d0,&local_1f0);
              std::operator+(&local_190,&local_1b0,"]");
              SVar3 = program_local._4_4_;
              SVar2 = (Storage)program_local;
              pPVar1 = pPStack_30;
              pVVar14 = glu::VarType::getElementType(varType);
              writeVariableReadAccumulateExpression
                        ((ostringstream *)psVar5,psVar4,&local_190,SVar3,SVar2,pPVar1,pVVar14);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_1f0);
              std::__cxx11::string::~string((string *)&local_1d0);
            }
          }
        }
        else {
          for (local_88[0] = 0; iVar8 = local_88[0], iVar9 = glu::VarType::getArraySize(varType),
              psVar5 = accumulatorName_local, psVar4 = name_local, iVar8 < iVar9;
              local_88[0] = local_88[0] + 1) {
            std::operator+(&local_e8,_storage_local,"[");
            de::toString<int>(&local_108,local_88);
            std::operator+(&local_c8,&local_e8,&local_108);
            std::operator+(&local_a8,&local_c8,"]");
            SVar3 = program_local._4_4_;
            SVar2 = (Storage)program_local;
            pPVar1 = pPStack_30;
            pVVar14 = glu::VarType::getElementType(varType);
            writeVariableReadAccumulateExpression
                      ((ostringstream *)psVar5,psVar4,&local_a8,SVar3,SVar2,pPVar1,pVVar14);
            std::__cxx11::string::~string((string *)&local_a8);
            std::__cxx11::string::~string((string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_108);
            std::__cxx11::string::~string((string *)&local_e8);
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void writeVariableReadAccumulateExpression (std::ostringstream&							buf,
												   const std::string&							accumulatorName,
												   const std::string&							name,
												   glu::ShaderType								shaderType,
												   glu::Storage									storage,
												   const ProgramInterfaceDefinition::Program*	program,
												   const glu::VarType&							varType)
{
	if (varType.isBasicType())
	{
		buf << "\t" << accumulatorName << " += ";

		if (glu::isDataTypeScalar(varType.getBasicType()))
			buf << "vec4(float(" << name << "))";
		else if (glu::isDataTypeVector(varType.getBasicType()))
			buf << "vec4(" << name << ".xyxy)";
		else if (glu::isDataTypeMatrix(varType.getBasicType()))
			buf << "vec4(float(" << name << "[0][0]))";
		else if (glu::isDataTypeSamplerMultisample(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ").x))";
		else if (glu::isDataTypeSampler(varType.getBasicType()))
			buf << "vec4(float(textureSize(" << name << ", 0).x))";
		else if (glu::isDataTypeImage(varType.getBasicType()))
			buf << "vec4(float(imageSize(" << name << ").x))";
		else if (varType.getBasicType() == glu::TYPE_UINT_ATOMIC_COUNTER)
			buf << "vec4(float(atomicCounterIncrement(" << name << ")))";
		else
			DE_ASSERT(false);

		buf << ";\n";
	}
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "." + varType.getStructPtr()->getMember(ndx).getName(),
												  shaderType,
												  storage,
												  program,
												  varType.getStructPtr()->getMember(ndx).getType());
	}
	else if (varType.isArrayType())
	{
		if (varType.getArraySize() != glu::VarType::UNSIZED_ARRAY)
		{
			for (int ndx = 0; ndx < varType.getArraySize(); ++ndx)
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[" + de::toString(ndx) + "]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
		}
		else if (storage == glu::STORAGE_BUFFER)
		{
			// run-time sized array, read arbitrary
			writeVariableReadAccumulateExpression(buf,
												  accumulatorName,
												  name + "[8]",
												  shaderType,
												  storage,
												  program,
												  varType.getElementType());
		}
		else
		{
			DE_ASSERT(storage == glu::STORAGE_IN);

			if (shaderType == glu::SHADERTYPE_GEOMETRY)
			{
				// implicit sized geometry input array, size = primitive size. Just reading first is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[0]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_CONTROL)
			{
				// implicit sized tessellation input array, size = input patch max size. Just reading current is enough
				writeVariableReadAccumulateExpression(buf,
													  accumulatorName,
													  name + "[gl_InvocationID]",
													  shaderType,
													  storage,
													  program,
													  varType.getElementType());
			}
			else if (shaderType == glu::SHADERTYPE_TESSELLATION_EVALUATION)
			{
				// implicit sized tessellation input array, size = output patch max size. Read all to prevent optimizations
				DE_ASSERT(program->getTessellationNumOutputPatchVertices() > 0);
				for (int ndx = 0; ndx < (int)program->getTessellationNumOutputPatchVertices(); ++ndx)
				{
					writeVariableReadAccumulateExpression(buf,
														  accumulatorName,
														  name + "[" + de::toString(ndx) + "]",
														  shaderType,
														  storage,
														  program,
														  varType.getElementType());
				}
			}
			else
				DE_ASSERT(false);
		}
	}
	else
		DE_ASSERT(false);
}